

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::ServiceDescriptor::CopyTo(ServiceDescriptor *this,ServiceDescriptorProto *proto)

{
  undefined8 uVar1;
  ulong uVar2;
  long lVar3;
  MethodDescriptorProto *proto_00;
  ServiceOptions *this_00;
  undefined8 *puVar4;
  int i;
  long lVar5;
  long lVar6;
  
  uVar1 = *(undefined8 *)(this + 8);
  (proto->_has_bits_).has_bits_[0] = (proto->_has_bits_).has_bits_[0] | 1;
  uVar2 = (proto->super_Message).super_MessageLite._internal_metadata_.ptr_;
  puVar4 = (undefined8 *)(uVar2 & 0xfffffffffffffffc);
  if ((uVar2 & 1) != 0) {
    puVar4 = (undefined8 *)*puVar4;
  }
  internal::ArenaStringPtr::Set(&proto->name_,uVar1,puVar4);
  lVar6 = 0;
  for (lVar5 = 0; lVar5 < *(int *)(this + 0x28); lVar5 = lVar5 + 1) {
    lVar3 = *(long *)(this + 0x20);
    proto_00 = RepeatedPtrField<google::protobuf::MethodDescriptorProto>::Add(&proto->method_);
    MethodDescriptor::CopyTo((MethodDescriptor *)(lVar3 + lVar6),proto_00);
    lVar6 = lVar6 + 0x40;
  }
  if (*(undefined1 **)(this + 0x18) != _ServiceOptions_default_instance_) {
    this_00 = ServiceDescriptorProto::_internal_mutable_options(proto);
    ServiceOptions::CopyFrom(this_00,*(ServiceOptions **)(this + 0x18));
    return;
  }
  return;
}

Assistant:

void ServiceDescriptor::CopyTo(ServiceDescriptorProto* proto) const {
  proto->set_name(name());

  for (int i = 0; i < method_count(); i++) {
    method(i)->CopyTo(proto->add_method());
  }

  if (&options() != &ServiceOptions::default_instance()) {
    proto->mutable_options()->CopyFrom(options());
  }
}